

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O0

QString * __thiscall
CPP::WriteInitialization::pixCall(WriteInitialization *this,QLatin1StringView t,QString *text)

{
  bool bVar1;
  QTextStream *pQVar2;
  undefined8 in_RCX;
  QLatin1String *in_RDX;
  long in_RSI;
  QString *in_RDI;
  QString *in_R8;
  long in_FS_OFFSET;
  QString *result;
  QString pixFunc;
  QTextStream str;
  undefined4 in_stack_ffffffffffffff18;
  OpenModeFlag in_stack_ffffffffffffff1c;
  QLatin1String *in_stack_ffffffffffffff20;
  QString *str_00;
  _string<false> local_a0;
  _string<true> local_90;
  QString local_80;
  QLatin1String *local_68;
  undefined8 local_60;
  uint local_54;
  undefined8 local_50;
  undefined8 local_48;
  QLatin1StringView local_40;
  QLatin1String *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RCX;
  bVar1 = QString::isEmpty((QString *)0x13cd1c);
  if (bVar1) {
    local_40 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)str_00,(size_t)in_stack_ffffffffffffff20);
    ::operator%(in_stack_ffffffffffffff20,
                (QLatin1String *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    ::QStringBuilder::operator_cast_to_QString
              ((QStringBuilder<QLatin1String_&,_QLatin1String> *)
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  else {
    (str_00->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
    (str_00->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    (str_00->d).size = -0x5555555555555556;
    QString::QString((QString *)0x13cda6);
    local_50 = 0xaaaaaaaaaaaaaaaa;
    local_48 = 0xaaaaaaaaaaaaaaaa;
    QFlags<QIODeviceBase::OpenModeFlag>::QFlags
              ((QFlags<QIODeviceBase::OpenModeFlag> *)in_stack_ffffffffffffff20,
               in_stack_ffffffffffffff1c);
    QTextStream::QTextStream((QTextStream *)&local_50,str_00,(QFlags_conflict *)(ulong)local_54);
    local_68 = local_18;
    local_60 = local_10;
    QTextStream::operator<<((QTextStream *)&local_50,local_18);
    QTextStream::operator<<((QTextStream *)&local_50,'(');
    local_80.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_80.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_80.d.size = -0x5555555555555556;
    Uic::pixmapFunction((Uic *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    bVar1 = QString::isEmpty((QString *)0x13ce7f);
    if (bVar1) {
      language::_string<true>::_string(&local_90,in_R8,(QString *)(in_RSI + 0x40));
      language::operator<<
                ((QTextStream *)in_stack_ffffffffffffff20,
                 (_string<true> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
    else {
      pQVar2 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_50,&local_80);
      pQVar2 = (QTextStream *)QTextStream::operator<<(pQVar2,'(');
      language::_string<false>::_string(&local_a0,in_R8,(QString *)(in_RSI + 0x40));
      pQVar2 = language::operator<<
                         (pQVar2,(_string<false> *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
      QTextStream::operator<<(pQVar2,')');
    }
    QTextStream::operator<<((QTextStream *)&local_50,')');
    QString::~QString((QString *)0x13cf2a);
    QTextStream::~QTextStream((QTextStream *)&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString WriteInitialization::pixCall(QLatin1StringView t, const QString &text) const
{
    if (text.isEmpty())
        return t % "()"_L1;

    QString result;
    QTextStream str(&result);
    str << t;
    str << '(';
    const QString pixFunc = m_uic->pixmapFunction();
    if (pixFunc.isEmpty())
        str << language::qstring(text, m_dindent);
    else
        str << pixFunc << '(' << language::charliteral(text, m_dindent) << ')';
    str << ')';
    return result;
}